

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:76:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:87:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/text_pipeline.cpp:97:36)>_>
::_construct_deferred_tokens
          (Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:76:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:87:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_text_pipeline_cpp:97:36)>_>
           *this,Pipeflow *pf)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__args_2;
  long in_RDI;
  unsigned_long *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  tuple<unsigned_long_&> *in_stack_ffffffffffffffd0;
  piecewise_construct_t *in_stack_ffffffffffffffd8;
  unordered_map<unsigned_long,_tf::DeferredPipeflow,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>_>
  *in_stack_ffffffffffffffe0;
  
  __args_2 = (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)(in_RDI + 0x138);
  std::forward_as_tuple<unsigned_long&>((unsigned_long *)__args_2);
  std::
  forward_as_tuple<unsigned_long&,unsigned_long&,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unsigned_long *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc0,__args_2);
  std::
  unordered_map<unsigned_long,tf::DeferredPipeflow,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,tf::DeferredPipeflow>>>
  ::
  emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<unsigned_long&,unsigned_long&,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>&&>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             (tuple<unsigned_long_&,_unsigned_long_&,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_&&>
              *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void Pipeline<Ps...>::_construct_deferred_tokens(Pipeflow& pf) {
  
  //auto res = _deferred_tokens.emplace(
  //  pf._token, DeferredPipeflow{pf._token, pf._num_deferrals, std::move(pf._dependents)}
  //);
  
  // construct the deferred pipeflow with zero copy
  //auto res = _deferred_tokens.emplace(
  _deferred_tokens.emplace(
    std::piecewise_construct,
    std::forward_as_tuple(pf._token),
    std::forward_as_tuple(
      pf._token, pf._num_deferrals, std::move(pf._dependents)
    )
  );

  //assert(res.second == true);
}